

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateGeneric::IntLoadConstraint_C
          (ChLinkMateGeneric *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ChConstraintTwoBodies *pCVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  int i;
  int i_00;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar14 [64];
  double local_88;
  ulong local_48;
  
  auVar14._8_56_ = in_register_00001248;
  auVar14._0_8_ = recovery_clamp;
  auVar10._8_8_ = 0x8000000000000000;
  auVar10._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar14._0_16_,auVar10);
  iVar9 = 0;
  for (i_00 = 0; i_00 < (this->mask).nconstr; i_00 = i_00 + 1) {
    pCVar6 = ChLinkMask::Constr_N(&this->mask,i_00);
    if ((pCVar6->super_ChConstraintTwo).super_ChConstraint.active == true) {
      if (do_clamp) {
        pCVar6 = ChLinkMask::Constr_N(&this->mask,i_00);
        iVar5 = (*(pCVar6->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[3])(pCVar6);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)&this->C,
                            (long)iVar9);
        local_48 = auVar10._0_8_;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_48;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = c * *pSVar7;
        auVar4 = vmaxsd_avx(auVar11,auVar2);
        if ((char)iVar5 == '\0') {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = recovery_clamp;
          auVar4 = vminsd_avx(auVar4,auVar3);
          local_88 = auVar4._0_8_;
        }
        else {
          local_88 = auVar4._0_8_;
        }
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                            (ulong)(iVar9 + off_L));
        *pSVar8 = local_88 + *pSVar8;
      }
      else {
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)&this->C,
                            (long)iVar9);
        SVar1 = *pSVar7;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                            (ulong)(iVar9 + off_L));
        auVar12._8_8_ = 0;
        auVar12._0_8_ = c;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = SVar1;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *pSVar8;
        auVar4 = vfmadd213sd_fma(auVar13,auVar12,auVar4);
        *pSVar8 = auVar4._0_8_;
      }
      iVar9 = iVar9 + 1;
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntLoadConstraint_C(const unsigned int off_L,
                                            ChVectorDynamic<>& Qc,
                                            const double c,
                                            bool do_clamp,
                                            double recovery_clamp) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            if (do_clamp) {
                if (mask.Constr_N(i).IsUnilateral())
                    Qc(off_L + cnt) += ChMax(c * C(cnt), -recovery_clamp);
                else
                    Qc(off_L + cnt) += ChMin(ChMax(c * C(cnt), -recovery_clamp), recovery_clamp);
            } else
                Qc(off_L + cnt) += c * C(cnt);
            cnt++;
        }
    }
}